

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void mbedtls_gf128mul_x_ble(uchar *r,uchar *x)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint64_t rb;
  uint64_t ra;
  uint64_t b;
  uint64_t a;
  uchar *x_local;
  uchar *r_local;
  
  bVar1 = x[7];
  uVar2 = ((ulong)bVar1 << 0x38 | (ulong)x[6] << 0x30 | (ulong)x[5] << 0x28 | (ulong)x[4] << 0x20 |
           (ulong)x[3] << 0x18 | (ulong)x[2] << 0x10 | (ulong)x[1] << 8 | (ulong)*x) << 1 ^
          (long)(0x87 >> (8U - (char)((((ulong)x[0xf] << 0x38) >> 0x3f) << 3) & 0x1f));
  lVar3 = ((ulong)x[0xf] << 0x38 | (ulong)x[0xe] << 0x30 | (ulong)x[0xd] << 0x28 |
           (ulong)x[0xc] << 0x20 | (ulong)x[0xb] << 0x18 | (ulong)x[10] << 0x10 | (ulong)x[9] << 8 |
          (ulong)x[8]) << 1;
  r[7] = (uchar)(uVar2 >> 0x38);
  r[6] = (uchar)(uVar2 >> 0x30);
  r[5] = (uchar)(uVar2 >> 0x28);
  r[4] = (uchar)(uVar2 >> 0x20);
  r[3] = (uchar)(uVar2 >> 0x18);
  r[2] = (uchar)(uVar2 >> 0x10);
  r[1] = (uchar)(uVar2 >> 8);
  *r = (uchar)uVar2;
  r[0xf] = (uchar)((ulong)lVar3 >> 0x38);
  r[0xe] = (uchar)((ulong)lVar3 >> 0x30);
  r[0xd] = (uchar)((ulong)lVar3 >> 0x28);
  r[0xc] = (uchar)((ulong)lVar3 >> 0x20);
  r[0xb] = (uchar)((ulong)lVar3 >> 0x18);
  r[10] = (uchar)((ulong)lVar3 >> 0x10);
  r[9] = (uchar)((ulong)lVar3 >> 8);
  r[8] = bVar1 >> 7 | (byte)lVar3;
  return;
}

Assistant:

static void mbedtls_gf128mul_x_ble( unsigned char r[16],
                                    const unsigned char x[16] )
{
    uint64_t a, b, ra, rb;

    GET_UINT64_LE( a, x, 0 );
    GET_UINT64_LE( b, x, 8 );

    ra = ( a << 1 )  ^ 0x0087 >> ( 8 - ( ( b >> 63 ) << 3 ) );
    rb = ( a >> 63 ) | ( b << 1 );

    PUT_UINT64_LE( ra, r, 0 );
    PUT_UINT64_LE( rb, r, 8 );
}